

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmctest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  int *__ptr;
  int *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  ostream *poVar5;
  void *__ptr_04;
  void *__ptr_05;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  int iVar10;
  double dVar11;
  long lVar12;
  bool bVar13;
  int i_1;
  pointer pdVar14;
  long lVar15;
  undefined8 uVar16;
  double local_448;
  uint *puStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_3f8;
  double evec [16];
  double ivec [16];
  int originalIndices [6];
  undefined8 uStack_2d8;
  int transposeIndices [6];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  double dStack_248;
  double freqs [4];
  int nodeIndices [4];
  double edgeLengths [4];
  uint local_1b8 [2];
  BeagleInstanceDetails instDetails;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined1 local_170 [8];
  vector<double,_std::allocator<double>_> scaledQ;
  vector<double,_std::allocator<double>_> scaledQ2;
  int stateFrequencyIndex;
  int cumulativeScalingIndex;
  double logL;
  vector<double,_std::allocator<double>_> siteLogLikelihoods;
  vector<double,_std::allocator<double>_> element;
  undefined8 uStack_e8;
  int postBufferIndices [4];
  int preBufferIndices [4];
  undefined1 local_c0 [8];
  vector<double,_std::allocator<double>_> sumBuffer;
  undefined1 auStack_a0 [4];
  int categoryRatesIndex;
  vector<double,_std::allocator<double>_> firstBuffer;
  int local_60;
  undefined4 local_5c;
  int iStack_58;
  int rootIndex;
  allocator_type local_49;
  undefined4 local_48;
  int local_44;
  int categoryWeightsIndex;
  int local_34;
  
  puStack_440 = (uint *)0x1028c3;
  plVar3 = (long *)beagleGetResourceList();
  puStack_440 = (uint *)0x1028e3;
  fwrite("Available resources:\n",0x15,1,_stdout);
  lVar12 = 0;
  for (uVar9 = 0; (long)uVar9 < (long)(int)plVar3[1]; uVar9 = uVar9 + 1) {
    puStack_440 = (uint *)0x102913;
    fprintf(_stdout,"\tResource %i:\n\t\tName : %s\n",uVar9 & 0xffffffff,
            *(undefined8 *)(*plVar3 + lVar12));
    puStack_440 = (uint *)0x10292d;
    fprintf(_stdout,"\t\tDesc : %s\n",*(undefined8 *)(*plVar3 + 8 + lVar12));
    puStack_440 = (uint *)0x102943;
    fwrite("\t\tFlags:",8,1,_stdout);
    puStack_440 = (uint *)0x102950;
    printFlags(*(long *)(*plVar3 + 0x10 + lVar12));
    puStack_440 = (uint *)0x10295c;
    fputc(10,_stdout);
    lVar12 = lVar12 + 0x20;
  }
  puStack_440 = (uint *)0x10296d;
  fputc(10,_stdout);
  puStack_440 = (uint *)0x102979;
  _iStack_58 = strlen(human);
  if (argc < 2) {
    local_60 = -1;
    piVar4 = (int *)0x0;
  }
  else {
    puStack_440 = (uint *)0x10299b;
    iVar2 = strcmp(argv[1],"--gpu");
    local_60 = -1;
    if (argc == 2 || iVar2 != 0) {
      piVar4 = (int *)0x0;
    }
    else {
      puStack_440 = (uint *)0x1029bc;
      lVar12 = atol(argv[2]);
      piVar4 = (int *)0x0;
      local_60 = -1;
      if (-1 < (int)lVar12) {
        piVar4 = &local_60;
        local_60 = (int)lVar12;
      }
    }
  }
  puStack_440 = local_1b8;
  local_448 = 1.01975149301633e-320;
  iVar2 = beagleCreateInstance(3,10,3,4,_iStack_58,1,0xc,1,0,piVar4);
  if (-1 < iVar2) {
    puStack_440 = (uint *)0x102a68;
    fprintf(_stdout,"Using resource %i:\n",(ulong)local_1b8[0]);
    puStack_440 = (uint *)0x102a80;
    fprintf(_stdout,"\tRsrc Name : %s\n",instDetails._0_8_);
    puStack_440 = (uint *)0x102a98;
    fprintf(_stdout,"\tImpl Name : %s\n",instDetails.resourceName);
    puStack_440 = (uint *)0x102ab0;
    fprintf(_stdout,"\tImpl Desc : %s\n",instDetails.implName);
    puStack_440 = (uint *)0x102abb;
    fputc(10,_stdout);
    puStack_440 = (uint *)0x102ace;
    piVar4 = getStates(human,1);
    puStack_440 = (uint *)0x102ae0;
    __ptr = getStates(chimp,1);
    puStack_440 = (uint *)0x102af2;
    __ptr_00 = getStates(gorilla,1);
    puStack_440 = (uint *)0x102b02;
    beagleSetTipStates(iVar2,0,piVar4);
    puStack_440 = (uint *)0x102b10;
    beagleSetTipStates(iVar2,1,__ptr);
    puStack_440 = (uint *)0x102b1e;
    beagleSetTipStates(iVar2,2,__ptr_00);
    puStack_440 = (uint *)0x102b26;
    free(piVar4);
    puStack_440 = (uint *)0x102b2e;
    free(__ptr);
    puStack_440 = (uint *)0x102b36;
    free(__ptr_00);
    local_448 = 1.0;
    local_34 = iVar2;
    beagleSetCategoryRates(iVar2,&local_448);
    sVar1 = _iStack_58;
    lVar12 = _iStack_58 << 0x20;
    __ptr_01 = malloc(lVar12 >> 0x1d);
    iVar2 = local_34;
    uVar6 = ~((int)(uint)sVar1 >> 0x1f) & (uint)sVar1;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)__ptr_01 + uVar9 * 8) = 0x3ff0000000000000;
    }
    beagleSetPatternWeights(local_34,__ptr_01);
    dStack_248 = 0.1;
    freqs[0] = 0.3;
    freqs[1] = 0.2;
    freqs[2] = 0.4;
    beagleSetStateFrequencies(iVar2,0);
    beagleSetCategoryWeights(iVar2,0);
    evec[7] = -0.1091089;
    evec[8] = -0.896939683;
    evec[9] = -0.11849713;
    evec[10] = -0.5;
    evec[0xb] = -0.1091089;
    evec[0xc] = 0.440330814;
    evec[0xd] = -0.56393254;
    evec[0xe] = -0.5;
    uStack_3f8 = 0x3fef6c625e99e94b;
    evec[0] = 0.040022305;
    evec[1] = 0.04454354;
    evec[2] = -0.5;
    evec[3] = -0.1091089;
    evec[4] = -0.002488732;
    evec[5] = 0.81606029;
    evec[6] = -0.5;
    ivec[7] = 0.0;
    ivec[8] = 0.8113638;
    ivec[9] = -0.2686725;
    ivec[10] = -0.5426913;
    ivec[0xb] = -0.2;
    ivec[0xc] = -0.6;
    ivec[0xd] = -0.4;
    ivec[0xe] = -0.8;
    evec[0xf] = 0.9165151;
    ivec[0] = -0.3533241;
    ivec[1] = -0.1573578;
    ivec[2] = -0.4058332;
    ivec[3] = 0.0;
    ivec[4] = 0.2702596;
    ivec[5] = -0.8372848;
    ivec[6] = 0.5670252;
    edgeLengths[3] = -1.4285710561809946;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_170,0x20,
               (allocator_type *)&local_2b8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &scaledQ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x20,(allocator_type *)&local_2b8);
    iVar2 = local_34;
    firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(lVar12 >> 0x20);
    for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 8) {
      *(double *)((long)local_170 + lVar8) = *(double *)((long)&DAT_00104240 + lVar8) * local_448;
      *(double *)
       ((long)scaledQ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + lVar8) =
           local_448 * local_448 * *(double *)((long)&DAT_00104340 + lVar8);
    }
    beagleSetEigenDecomposition(local_34,0,&uStack_3f8,evec + 0xf,edgeLengths + 3);
    freqs[3] = 2.12199579096527e-314;
    nodeIndices[0] = 2;
    nodeIndices[1] = 3;
    nodeIndices[2] = 0;
    nodeIndices[3] = 0x3ff00000;
    edgeLengths[0] = 1.0;
    edgeLengths[1] = 1.0;
    edgeLengths[2] = 1.0;
    uVar16 = 4;
    beagleUpdateTransitionMatrices(iVar2,0,freqs + 3,0,0);
    beagleSetTransitionMatrix(0,iVar2,4,local_170,uVar16);
    beagleSetTransitionMatrix
              (0,iVar2,5,
               scaledQ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    transposeIndices[2] = 10;
    transposeIndices[3] = 0xb;
    ivec[0xf] = 2.12199579096527e-314;
    uStack_2d8 = 0x700000006;
    transposeIndices[0] = 8;
    transposeIndices[1] = 9;
    beagleTransposeTransitionMatrices(iVar2,ivec + 0xf,&uStack_2d8,6);
    __ptr_02 = malloc(0x80);
    __ptr_03 = malloc(0x80);
    beagleGetTransitionMatrix(iVar2,0,__ptr_02);
    beagleGetTransitionMatrix(iVar2,6,__ptr_03);
    poVar5 = std::operator<<((ostream *)&std::cout,"Matrix for node ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar13 = true;
    _categoryWeightsIndex = 0.0;
    while (bVar13) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  rate category");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
      std::operator<<(poVar5,": \n");
      iVar2 = SUB84(_categoryWeightsIndex,0);
      for (iVar10 = 0; iVar10 != 4; iVar10 = iVar10 + 1) {
        local_44 = iVar2 + 4;
        _categoryWeightsIndex = (double)(ulong)(categoryWeightsIndex + 4);
        for (lVar8 = (long)categoryWeightsIndex; iVar2 + 4 != lVar8; lVar8 = lVar8 + 1) {
          poVar5 = std::ostream::_M_insert<double>(*(double *)((long)__ptr_02 + lVar8 * 8));
          std::operator<<(poVar5,", ");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        iVar2 = local_44;
      }
      bVar13 = false;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Matrix-transpose for node ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar13 = true;
    _categoryWeightsIndex = 0.0;
    while (iVar2 = local_34, bVar13) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  rate category");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
      std::operator<<(poVar5,": \n");
      iVar2 = SUB84(_categoryWeightsIndex,0);
      for (iVar10 = 0; iVar10 != 4; iVar10 = iVar10 + 1) {
        local_44 = iVar2 + 4;
        _categoryWeightsIndex = (double)(ulong)(categoryWeightsIndex + 4);
        for (lVar8 = (long)categoryWeightsIndex; iVar2 + 4 != lVar8; lVar8 = lVar8 + 1) {
          poVar5 = std::ostream::_M_insert<double>(*(double *)((long)__ptr_03 + lVar8 * 8));
          std::operator<<(poVar5,", ");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        iVar2 = local_44;
      }
      bVar13 = false;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    local_5c = 4;
    local_438 = 0xffffffff00000003;
    uStack_430 = 0xffffffff;
    uStack_428 = 0x100000000;
    uStack_420 = 0x400000001;
    local_418 = 0xffffffffffffffff;
    uStack_410 = 0x200000002;
    local_408 = 0x300000003;
    beagleUpdatePartials(local_34,&local_438,2,0xffffffffffffffff);
    local_48 = 0;
    local_2b8 = 0xffffffff00000006;
    uStack_2b0 = 0x5ffffffff;
    uStack_2a8 = 0x200000003;
    uStack_2a0 = 0x700000002;
    uStack_298 = 0xffffffffffffffff;
    uStack_290 = 0x200000005;
    uStack_288 = 0x300000003;
    uStack_280 = 0xffffffff00000008;
    local_278 = 0x6ffffffff;
    uStack_270 = 1;
    uStack_268 = 0x900000000;
    uStack_260 = 0xffffffffffffffff;
    local_258 = 6;
    uStack_250 = 0x100000001;
    beagleCalculateRootLogLikelihoods(iVar2,&local_5c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&logL,
               (size_type)
               firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(allocator_type *)auStack_a0);
    beagleGetSiteLogLikelihoods(local_34,logL);
    std::operator<<((ostream *)&std::cout,"site-log-like:");
    for (; (pointer)logL !=
           siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start; logL = (double)((long)logL + 8)) {
      _categoryWeightsIndex = *(double *)logL;
      std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<double>(_categoryWeightsIndex);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    __ptr_04 = malloc(lVar12 >> 0x1b);
    iVar2 = local_34;
    bVar13 = true;
    iVar10 = 0;
    while (bVar13) {
      for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          *(double *)((long)__ptr_04 + lVar8 * 8 + (long)iVar10 * 8) = freqs[lVar8 + -1];
        }
        iVar10 = iVar10 + 4;
      }
      bVar13 = false;
    }
    beagleSetPartials(local_34,5,__ptr_04);
    fprintf(_stdout,"Setting preroot: %d\n",5);
    beagleUpdatePrePartials(iVar2,&local_2b8,4,0xffffffffffffffff);
    fprintf(_stdout,"logL = %.5f (R = -18.04619478977292)\n\n",0);
    sumBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = local_48;
    uStack_e8 = 1;
    postBufferIndices[0] = 2;
    postBufferIndices[1] = 3;
    postBufferIndices[2] = 8;
    postBufferIndices[3] = 9;
    local_188 = 4;
    uStack_184 = 4;
    uStack_180 = 4;
    uStack_17c = 4;
    __ptr_05 = malloc(lVar12 >> 0x1b);
    beagleGetPartials(iVar2,local_5c,0xffffffffffffffff,__ptr_04);
    pdVar14 = (pointer)0x0;
    while (iVar2 = (int)pdVar14, iVar2 != 5) {
      beagleGetPartials(local_34,iVar2 + 5,0xffffffffffffffff);
      poVar5 = std::operator<<((ostream *)&std::cout,"Pre-order Partial for node ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,4 - iVar2);
      std::operator<<(poVar5,": \n");
      bVar13 = true;
      dVar11 = 0.0;
      firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar14;
      while (bVar13) {
        poVar5 = std::operator<<((ostream *)&std::cout,"  rate category");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
        std::operator<<(poVar5,": \n");
        iVar2 = SUB84(dVar11,0);
        for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          _categoryWeightsIndex = (double)(ulong)(SUB84(dVar11,0) + 4);
          local_44 = iVar2 + 4;
          for (lVar12 = (long)SUB84(dVar11,0); iVar2 + 4 != lVar12; lVar12 = lVar12 + 1) {
            poVar5 = std::ostream::_M_insert<double>(*(double *)((long)__ptr_05 + lVar12 * 8));
            std::operator<<(poVar5,", ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          dVar11 = _categoryWeightsIndex;
          iVar2 = local_44;
        }
        bVar13 = false;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      pdVar14 = (pointer)(ulong)((int)firstBuffer.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 1);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)auStack_a0,(long)((int)_iStack_58 * 8),
               (allocator_type *)local_c0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_c0,4,
               (allocator_type *)
               &siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    beagleCalculateEdgeDerivatives
              (local_34,&uStack_e8,postBufferIndices + 2,&local_188,&local_48,4,_auStack_a0,local_c0
               ,0);
    std::operator<<((ostream *)&std::cout,"check gradients  :");
    uVar7 = (int)_iStack_58 * 4;
    for (uVar9 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar9; uVar9 = uVar9 + 1) {
      std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<double>(_auStack_a0[uVar9]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar15 = (long)iStack_58;
    lVar12 = 0;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      _categoryWeightsIndex = 0.0;
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        _categoryWeightsIndex =
             _categoryWeightsIndex + *(double *)((long)_auStack_a0 + uVar9 * 8 + lVar12);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"node ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar8);
      std::operator<<(poVar5,": ");
      poVar5 = std::ostream::_M_insert<double>(_categoryWeightsIndex);
      std::operator<<(poVar5," ?= ");
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_c0 + lVar8 * 8));
      std::endl<char,std::char_traits<char>>(poVar5);
      lVar12 = lVar12 + lVar15 * 8;
    }
    std::operator<<((ostream *)&std::cout,"\n\ncheck cross-products  :\n");
    instDetails.flags = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x20,(value_type *)&instDetails.flags,
               &local_49);
    siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[0x10] = -1.0;
    siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[0x11] = 1.0;
    *siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = -1.0;
    siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1] = 1.0;
    beagleSetTransitionMatrix(0,local_34,4);
    beagleSetTransitionMatrix
              (0,local_34,5,
               siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<((ostream *)&std::cout,"transpose = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::operator<<(poVar5,"\n");
    beagleCalculateEdgeDerivatives
              (local_34,&uStack_e8,postBufferIndices + 2,&local_188,&local_48,4,_auStack_a0,local_c0
               ,0);
    std::operator<<((ostream *)&std::cout,"sum buffer for element:");
    _categoryWeightsIndex = 0.0;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      _categoryWeightsIndex = _categoryWeightsIndex + *(double *)((long)local_c0 + lVar12 * 8);
      std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<double>(*(double *)((long)local_c0 + lVar12 * 8));
    }
    std::operator<<((ostream *)&std::cout," == ");
    poVar5 = std::ostream::_M_insert<double>(_categoryWeightsIndex);
    std::operator<<(poVar5,"\n");
    *_auStack_a0 = 0.0;
    _auStack_a0[1] = 0.0;
    beagleCalculateCrossProductDerivative
              (local_34,&uStack_e8,postBufferIndices + 2,
               (undefined1 *)
               ((long)&sumBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),&local_48,nodeIndices + 2,4,
               _auStack_a0,0);
    std::operator<<((ostream *)&std::cout,"now: ");
    poVar5 = std::ostream::_M_insert<double>(*_auStack_a0);
    std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<double>(_auStack_a0[1]);
    std::operator<<(poVar5," ?= ");
    poVar5 = std::ostream::_M_insert<double>(_auStack_a0[1] - *_auStack_a0);
    std::endl<char,std::char_traits<char>>(poVar5);
    free(__ptr_01);
    free(__ptr_05);
    free(__ptr_04);
    free(__ptr_02);
    free(__ptr_03);
    beagleFinalizeInstance(local_34);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &siteLogLikelihoods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_c0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)auStack_a0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&logL);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &scaledQ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_170);
    return 0;
  }
  puStack_440 = (uint *)0x1037aa;
  fwrite("Failed to obtain BEAGLE instance\n\n",0x22,1,_stderr);
  puStack_440 = (uint *)&LAB_001037b2;
  exit(1);
}

Assistant:

int main( int argc, const char* argv[] )
{
    // print resource list
    BeagleResourceList* rList;
    rList = beagleGetResourceList();
    fprintf(stdout, "Available resources:\n");
    for (int i = 0; i < rList->length; i++) {
        fprintf(stdout, "\tResource %i:\n\t\tName : %s\n", i, rList->list[i].name);
        fprintf(stdout, "\t\tDesc : %s\n", rList->list[i].description);
        fprintf(stdout, "\t\tFlags:");
        printFlags(rList->list[i].supportFlags);
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "\n");

//    bool scaling = true;
    bool scaling = false; // disable scaling for now

    bool doJC = true;

    bool singlePrecision = false;
    bool useSSE = true;

    // is nucleotides...
    int stateCount = 4;

    int nRepeats = 1;

    // get the number of site patterns
	int nPatterns = strlen(human) * nRepeats;

    // change # rate category to 2
//    int rateCategoryCount = 4;
    int rateCategoryCount = 1;

    int scaleCount = (scaling ? 7 : 0);

    bool useGpu = argc > 1 && strcmp(argv[1] , "--gpu") == 0;

    bool useTipStates = true;

    int whichDevice = -1;
    if (useGpu) {
        if (argc > 2) {
            whichDevice = atol(argv[2]);
            if (whichDevice < 0) {
                whichDevice = -1;
            }
        }
    }

    BeagleInstanceDetails instDetails;

    long preferenceFlags = BEAGLE_FLAG_SCALERS_RAW;

    if (useGpu) {
        preferenceFlags |= BEAGLE_FLAG_PROCESSOR_GPU;
    } else {
        preferenceFlags |= BEAGLE_FLAG_PROCESSOR_CPU;
    }

    if (singlePrecision) {
        preferenceFlags |= BEAGLE_FLAG_PRECISION_SINGLE;
    } else {
        preferenceFlags |= BEAGLE_FLAG_PRECISION_DOUBLE;
    }

    long requirementFlags = BEAGLE_FLAG_EIGEN_REAL;
    if (useSSE) {
        requirementFlags |= BEAGLE_FLAG_VECTOR_SSE;
    } else {
        requirementFlags |= BEAGLE_FLAG_VECTOR_NONE;
    }

    // create an instance of the BEAGLE library
	int instance = beagleCreateInstance(
                                  3,				/**< Number of tip data elements (input) */
                                  10,	            /**< Number of partials buffers to create (input) */
                                  useTipStates ? 3 : 0,		        /**< Number of compact state representation buffers to create (input) */
                                  stateCount,		/**< Number of states in the continuous-time Markov chain (input) */
                                  nPatterns,		/**< Number of site patterns to be handled by the instance (input) */
                                  1,		        /**< Number of rate matrix eigen-decomposition buffers to allocate (input) */
                                  6 * 2,		    /**< Number of rate matrix buffers (input) */
                                  rateCategoryCount,/**< Number of rate categories (input) */
                                  scaleCount,       /**< Number of scaling buffers */
                                  whichDevice >= 0 ? &whichDevice : NULL, /**< List of potential resource on which this instance is allowed (input, NULL implies no restriction */
                                  whichDevice >= 0 ? 1 : 0,			    /**< Length of resourceList list (input) */
                                  preferenceFlags,
                                  requirementFlags, /**< Bit-flags indicating required implementation characteristics, see BeagleFlags (input) */
                                  &instDetails);
    if (instance < 0) {
	    fprintf(stderr, "Failed to obtain BEAGLE instance\n\n");
	    exit(1);
    }


    int rNumber = instDetails.resourceNumber;
    fprintf(stdout, "Using resource %i:\n", rNumber);
    fprintf(stdout, "\tRsrc Name : %s\n",instDetails.resourceName);
    fprintf(stdout, "\tImpl Name : %s\n", instDetails.implName);
    fprintf(stdout, "\tImpl Desc : %s\n", instDetails.implDescription);
    fprintf(stdout, "\n");

    if (useTipStates) {
        // set the sequences for each tip using state likelihood arrays
        int *humanStates = getStates(human, nRepeats);
        int *chimpStates = getStates(chimp, nRepeats);
        int *gorillaStates = getStates(gorilla, nRepeats);

        beagleSetTipStates(instance, 0, humanStates);
        beagleSetTipStates(instance, 1, chimpStates);
        beagleSetTipStates(instance, 2, gorillaStates);

        free(humanStates);
        free(chimpStates);
        free(gorillaStates);

    } else {
        // set the sequences for each tip using partial likelihood arrays
        double *humanPartials = getPartials(human, nRepeats);
        double *chimpPartials = getPartials(chimp, nRepeats);
        double *gorillaPartials = getPartials(gorilla, nRepeats);

        beagleSetTipPartials(instance, 0, humanPartials);
        beagleSetTipPartials(instance, 1, chimpPartials);
        beagleSetTipPartials(instance, 2, gorillaPartials);

        free(humanPartials);
        free(chimpPartials);
        free(gorillaPartials);
    }

#ifdef _WIN32
	std::vector<double> rates(rateCategoryCount);
#else
	double rates[rateCategoryCount];
#endif
//    for (int i = 0; i < rateCategoryCount; i++) {
//        rates[i] = 1.0;
////        rates[i] = 3.0 * (i + 1) / (2 * rateCategoryCount + 1);
//    }

//    rates[0] = 0.14251623900062188;
//    rates[1] = 1.857483760999378;

    rates[0] = 1.0;

	beagleSetCategoryRates(instance, &rates[0]);

	double* patternWeights = (double*) malloc(sizeof(double) * nPatterns);

    for (int i = 0; i < nPatterns; i++) {
        patternWeights[i] = 1.0;
    }

    beagleSetPatternWeights(instance, patternWeights);

    // create base frequency array
	double freqs[4] = { 0.1, 0.3, 0.2, 0.4 };
//    double freqs[4] = { 0.25, 0.25, 0.25, 0.25 };

    beagleSetStateFrequencies(instance, 0, freqs);

    // create an array containing site category weights
#ifdef _WIN32
	std::vector<double> weights(rateCategoryCount);
#else
	double weights[rateCategoryCount];
#endif
    for (int i = 0; i < rateCategoryCount; i++) {
        weights[i] = 1.0/rateCategoryCount;
//        weights[i] = 2.0 * double(i + 1)/ double(rateCategoryCount * (rateCategoryCount + 1));
    }

    beagleSetCategoryWeights(instance, 0, &weights[0]);

//#ifndef JC
//	// an eigen decomposition for the 4-state 1-step circulant infinitesimal generator
//	double evec[4 * 4] = {
//			 -0.5,  0.6906786606674509,   0.15153543380548623, 0.5,
//			  0.5, -0.15153543380548576,  0.6906786606674498,  0.5,
//			 -0.5, -0.6906786606674498,  -0.15153543380548617, 0.5,
//			  0.5,  0.15153543380548554, -0.6906786606674503,  0.5
//	};
//
//	double ivec[4 * 4] = {
//			 -0.5,  0.5, -0.5,  0.5,
//			  0.6906786606674505, -0.15153543380548617, -0.6906786606674507,   0.15153543380548645,
//			  0.15153543380548568, 0.6906786606674509,  -0.15153543380548584, -0.6906786606674509,
//			  0.5,  0.5,  0.5,  0.5
//	};
//
//	double eval[8] = { -2.0, -1.0, -1.0, 0, 0, 1, -1, 0 };
//#else
//	// an eigen decomposition for the JC69 model
//	double evec[4 * 4] = {
//        1.0,  2.0,  0.0,  0.5,
//        1.0,  -2.0,  0.5,  0.0,
//        1.0,  2.0, 0.0,  -0.5,
//        1.0,  -2.0,  -0.5,  0.0
//	};
//
//	double ivec[4 * 4] = {
//        0.25,  0.25,  0.25,  0.25,
//        0.125,  -0.125,  0.125,  -0.125,
//        0.0,  1.0,  0.0,  -1.0,
//        1.0,  0.0,  -1.0,  0.0
//	};
//
//	double eval[8] = { 0.0, -1.3333333333333333, -1.3333333333333333, -1.3333333333333333,
//			0.0, 0.0, 0.0, 0.0 };
//#endif

    ///eigen decomposition of the HKY85 model
    double evec[4 * 4] = {
            0.9819805,  0.040022305,  0.04454354,  -0.5,
            -0.1091089, -0.002488732, 0.81606029,  -0.5,
            -0.1091089, -0.896939683, -0.11849713, -0.5,
            -0.1091089,  0.440330814, -0.56393254, -0.5
    };

    double ivec[4 * 4] = {
            0.9165151, -0.3533241, -0.1573578, -0.4058332,
            0.0,  0.2702596, -0.8372848,  0.5670252,
            0.0,  0.8113638, -0.2686725, -0.5426913,
            -0.2, -0.6, -0.4, -0.8
    };

    ///array of real parts + array of imaginary parts
    double eval[8] = { -1.42857105618099456, -1.42857095607719153, -1.42857087221423851, 0.0,
                       0.0, 0.0, 0.0, 0.0 };

    ///Q^T matrix
//    double QT[4 * 4] = {
//            -1.2857138,  0.1428570,  0.1428570,  0.1428570,
//            0.4285712, -0.9999997,  0.4285714,  0.4285713,
//            0.2857142,  0.2857143, -1.1428568,  0.2857142,
//            0.5714284,  0.5714284,  0.5714284, -0.8571426
//    };

    double Q[4 * 4 * 2] = {
            -1.285714,  0.4285712,  0.2857142,  0.5714284,
            0.142857, -0.9999997,  0.2857143,  0.5714284,
            0.142857,  0.4285714, -1.1428568,  0.5714284,
            0.142857,  0.4285713,  0.2857142, -0.8571426,
            -1.285714,  0.4285712,  0.2857142,  0.5714284,
            0.142857, -0.9999997,  0.2857143,  0.5714284,
            0.142857,  0.4285714, -1.1428568,  0.5714284,
            0.142857,  0.4285713,  0.2857142, -0.8571426
    };

    double Q2[4 * 4 * 2] = {
            1.8367333, -0.6122443, -0.4081629, -0.8163261,
            -0.2040814,  1.4285705, -0.4081632, -0.8163259,
            -0.2040814, -0.6122447,  1.6326522, -0.8163261,
            -0.2040814, -0.6122446, -0.4081630,  1.2244890,
            1.8367333, -0.6122443, -0.4081629, -0.8163261,
            -0.2040814,  1.4285705, -0.4081632, -0.8163259,
            -0.2040814, -0.6122447,  1.6326522, -0.8163261,
            -0.2040814, -0.6122446, -0.4081630,  1.2244890
    };

    std::vector<double> scaledQ(4 * 4 * 2);
    std::vector<double> scaledQ2(4 * 4 * 2);
//    std::vector<double> scaledQT(4 * 4 * 2);

    for (int rate = 0; rate < rateCategoryCount; ++rate) {
        for (int entry = 0; entry < stateCount * stateCount; ++entry) {
            scaledQ[entry + rate * stateCount * stateCount] = Q[entry + rate * stateCount * stateCount] * rates[rate];
            scaledQ2[entry + rate * stateCount * stateCount] = Q2[entry + rate * stateCount * stateCount] * rates[rate] * rates[rate];
        }
    }

    // set the Eigen decomposition
    beagleSetEigenDecomposition(instance, 0, evec, ivec, eval);

    // a list of indices and edge lengths
    int nodeIndices[4] = { 0, 1, 2, 3 };
//    double edgeLengths[4] = { 0.6, 0.6, 1.3, 0.7};
    double edgeLengths[4] = { 1.0, 1.0, 1.0, 1.0};

    // tell BEAGLE to populate the transition matrices for the above edge lengths
    beagleUpdateTransitionMatrices(instance,     // instance
	                         0,             // eigenIndex
	                         nodeIndices,   // probabilityIndices
	                         NULL,          // firstDerivativeIndices
	                         NULL,          // secondDervativeIndices
	                         edgeLengths,   // edgeLengths
	                         4);            // count

    beagleSetTransitionMatrix(instance, 4, scaledQ.data(), 0.0);
    beagleSetTransitionMatrix(instance, 5, scaledQ2.data(), 0.0);

    int originalIndices[6]  = { 0, 1, 2, 3, 4, 5 };
    int transposeIndices[6] = { 6, 7, 8, 9, 10, 11 };

    beagleTransposeTransitionMatrices(instance, originalIndices, transposeIndices, 6);

    double* matrix1 = (double*) malloc(sizeof(double) * stateCount * stateCount * rateCategoryCount);
    double* matrix2 = (double*) malloc(sizeof(double) * stateCount * stateCount * rateCategoryCount);

    beagleGetTransitionMatrix(instance, 0, matrix1);
    beagleGetTransitionMatrix(instance, 6, matrix2);

    int nodeId = 0;
    std::cout << "Matrix for node " << nodeId << std::endl;
    double* mat = matrix1;
    {
        int offset = 0;
        for (int r = 0; r < rateCategoryCount; r++) {
            std::cout << "  rate category" << r + 1 << ": \n";
            for (int i = 0; i < stateCount; i++) {
                for (int j = 0; j < stateCount; j++) {
                    std::cout << mat[offset++] << ", ";
                }
                std::cout << std::endl;
            }
            std::cout << std::endl;
        }
    }

    std::cout << "Matrix-transpose for node " << nodeId << std::endl;
    mat = matrix2;
    {
        int offset = 0;
        for (int r = 0; r < rateCategoryCount; r++) {
            std::cout << "  rate category" << r + 1 << ": \n";
            for (int i = 0; i < stateCount; i++) {
                for (int j = 0; j < stateCount; j++) {
                    std::cout << mat[offset++] << ", ";
                }
                std::cout << std::endl;
            }
            std::cout << std::endl;
        }
    }

    // create a list of partial likelihood update operations
    // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
	BeagleOperation operations[2] = {
		3, (scaling ? 0 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 0, 0, 1, 1,
		4, (scaling ? 1 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 2, 2, 3, 3
	};

	int rootIndex = 4;

    // update the partials
	beagleUpdatePartials(instance,      // instance
                   operations,     // eigenIndex
                   2,              // operationCount
                   BEAGLE_OP_NONE);          // cumulative scaling index

    ///XJ: I decided to store the pre-order partials vector in reverse order as those of post-orders
    ///This means that the two indices to the partials of root nodes are adjacent.
    ///For any node, the indices of the two partials sum to 2*(partialsBufferCount + compactBufferCount) - 1


    int categoryWeightsIndex = 0;
    int stateFrequencyIndex = 0;
    int transpose = (stateCount == 4 || !useGpu) ? 0 : 6;
    // create a list of partial likelihood update operations
    // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
    // destPartials point to the pre-order partials
    // partials1 = pre-order partials of the parent node
    // matrices1 = Ptr matrices of the current node (to the parent node)
    // partials2 = post-order partials of the sibling node
    // matrices2 = Ptr matrices of the sibling node (to the parent node)
    BeagleOperation pre_order_operations[4] = {
            6, (scaling ? 3 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 5, 3 + transpose, 2, 2,
            7, (scaling ? 4 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 5, 2 + transpose, 3, 3,
            8, (scaling ? 5 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 6, 1 + transpose, 0, 0,
            9, (scaling ? 6 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 6, 0 + transpose, 1, 1,
    };

    int rootPreIndex = 5;

    double *patternLogLik = (double*)malloc(sizeof(double) * nPatterns);

    int cumulativeScalingIndex = (scaling ? 2 : BEAGLE_OP_NONE);

    if (scaling) {
        int scalingFactorsCount = 2;
        int scalingFactorsIndices[2] = {0, 1};

        beagleResetScaleFactors(instance,
                                cumulativeScalingIndex);

        beagleAccumulateScaleFactors(instance,
                                     scalingFactorsIndices,
                                     scalingFactorsCount,
                                     cumulativeScalingIndex);
    }

    double logL = 0.0;

    // calculate the site likelihoods at the root node
    beagleCalculateRootLogLikelihoods(instance,               // instance
                                      (const int *)&rootIndex,// bufferIndices
                                      &categoryWeightsIndex,                // weights
                                      &stateFrequencyIndex,                  // stateFrequencies
                                      &cumulativeScalingIndex,// cumulative scaling index
                                      1,                      // count
                                      &logL);         // outLogLikelihoods


    std::vector<double> siteLogLikelihoods(nPatterns);
    beagleGetSiteLogLikelihoods(instance, siteLogLikelihoods.data());

    std::cout << "site-log-like:";
    for (double logLike : siteLogLikelihoods) {
        std::cout << " " << logLike;
    }
    std::cout << std::endl;

    double * seerootPartials = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);
    int offset = 0;
    for (int c = 0; c < rateCategoryCount; ++c) {
        for (int p = 0; p < nPatterns; ++p) {
            for (int s = 0; s < stateCount; ++s) {
                seerootPartials[offset++] = freqs[s];
            }
        }
    }
    beagleSetPartials(instance, rootPreIndex, seerootPartials);
    fprintf(stdout, "Setting preroot: %d\n", rootPreIndex);

//    beagleSetRootPrePartials(instance, // TODO Remove from API -- not necessary?
//                             (const int *) &rootPreIndex,               // bufferIndices
//                             &stateFrequencyIndex,                  // stateFrequencies
//                             1);                                    // count

    // update the pre-order partials
    beagleUpdatePrePartials(instance,
                            pre_order_operations,
                            4,
                            BEAGLE_OP_NONE);

    fprintf(stdout, "logL = %.5f (R = -18.04619478977292)\n\n", logL);

    int postBufferIndices[4] = {1, 0, 2, 3};
    int preBufferIndices[4] = {8, 9, 7, 6};
    int firstDervIndices[4] = {4 + transpose, 4 + transpose, 4 + transpose, 4 + transpose};
    int secondDervIndices[4] = {5 + transpose, 5 + transpose, 5 + transpose, 5 + transpose};
    int cumulativeScalingInices[4] = {6, 5, 4, 3};
    int categoryRatesIndex = categoryWeightsIndex;
    double* gradient = (double*) malloc(sizeof(double) * nPatterns * 4);
    double* diagonalHessian = (double*) malloc(sizeof(double) * nPatterns * 4);
    
    double * seeprePartials  = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);
    double * seepostPartials = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);

    double * tmpNumerator = (double*)   malloc(sizeof(double)  * nPatterns * rateCategoryCount);

    double * grand_denominator = (double*) malloc(sizeof(double)  * nPatterns);
    double * grand_numerator = (double*) malloc(sizeof(double)  * nPatterns);
    /// state frequencies stored in freqs
    /// category weights stored in weights


    beagleGetPartials(instance, rootIndex, BEAGLE_OP_NONE, seerootPartials);
    for(int i = 0; i < 5; i++){
        for(int m = 0; m < nPatterns; m++){
            grand_denominator[m] = 0;
            grand_numerator[m] = 0;
        }
        int postBufferIndex = 4-i;
        int preBufferIndex = 5+i;
        beagleGetPartials(instance, preBufferIndex, BEAGLE_OP_NONE, seeprePartials);
//        beagleGetPartials(instance, postBufferIndex, BEAGLE_OP_NONE, seepostPartials);

//        double * prePartialsPtr = seeprePartials;
//        double * postPartialsPtr = seepostPartials;
//
//        double denominator = 0;
//        double numerator = 0;
//
//        double tmp = 0;
//        int k, j, l, m, s, t;
//        std::cout<<"Gradient for branch (of node) "<< 4 -i <<": \n";
//
//        ///get likelihood for each rate category first
//        double clikelihood[rateCategoryCount * nPatterns];
//        l = 0; j = 0;
//        for(s = 0; s < rateCategoryCount; s++){
//            for(m = 0; m < nPatterns; m++){
//                double clikelihood_tmp = 0.0;
//                for(k=0; k < stateCount; k++){
//                    clikelihood_tmp += freqs[k] * seerootPartials[l++];
//                }
//                clikelihood[j++] = clikelihood_tmp;
//            }
//        }
//
//        ///now calculate weights
//        t = 0;
//        for(s = 0; s < rateCategoryCount; s++){
//            double ws = weights[s];
//            double rs = rates[s];
//            for(m=0; m < nPatterns; m++){
//                l = 0;
//                numerator = 0;
//                denominator = 0;
//                for(k = 0; k < stateCount; k++){
//                    tmp = 0.0;
//                    for(j=0; j < stateCount; j++){
//                        tmp += QT[k * stateCount + j] * prePartialsPtr[j];
//                    }
//                    numerator += tmp * postPartialsPtr[k];
//                    denominator += postPartialsPtr[k] * prePartialsPtr[k];
//                }
//                postPartialsPtr += stateCount;
//                prePartialsPtr  += stateCount;
////                tmpNumerator[t] = ws * rs * numerator / denominator * clikelihood[t];
//                tmpNumerator[t] = ws * rs * numerator;
//                //std::cout<< tmpNumerator[t]<<",  "<<ws*clikelihood[t]<<"  \n";
//                grand_numerator[m] += tmpNumerator[t];
//                grand_denominator[m] += ws * denominator /*clikelihood[t]*/;
//                t++;
//                std::cout<<numerator / denominator <<"  ";
//            }
//            std::cout<<std::endl;
//        }
//
//        for(m=0; m < nPatterns; m++){
//            std::cout<<grand_numerator[m] / grand_denominator[m] << "  ";
//        }
//        std::cout<<std::endl;
//
//        std::cout << "n: ";
//        for(m=0; m < nPatterns; m++){
//            std::cout<<grand_numerator[m] << "  ";
//        }
//        std::cout<<std::endl;
//
//        std::cout << "d: ";
//        for(m=0; m < nPatterns; m++){
//            std::cout<< grand_denominator[m] << "  ";
//        }
//        std::cout<<std::endl;

        std::cout<<"Pre-order Partial for node "<< 4-i << ": \n";

        int l = 0;
        for(int s = 0; s < rateCategoryCount; s++){
            std::cout<<"  rate category"<< s+1<< ": \n";
            for(int k = 0; k<nPatterns; k++){
                for(int j=0; j < stateCount; j++){
                    std::cout<<seeprePartials[l++]<<", ";
                }
                std::cout<<std::endl;
            }
            std::cout<<std::endl;
        }

    }

    std::vector<double> firstBuffer(nPatterns * 4 * 2); // Get both numerator and denominator
    std::vector<double> sumBuffer(4);
    int cumulativeScalingIndices[4] = {BEAGLE_OP_NONE, BEAGLE_OP_NONE, BEAGLE_OP_NONE, BEAGLE_OP_NONE};

    beagleCalculateEdgeDerivatives(instance,
                                   postBufferIndices, preBufferIndices,
                                   firstDervIndices,
                                   &categoryWeightsIndex,
                                   4,
                                   firstBuffer.data(),
                                   sumBuffer.data(),
                                   NULL);

    std::cout << "check gradients  :";
    for (int i = 0; i < 4 * nPatterns; ++i) {
        std::cout << " " << firstBuffer[i];
    }
    std::cout << std::endl;
//    std::cout << "check denominators:";
//    for (int i = 4 * nPatterns; i < 2 * 4 * nPatterns; ++i) {
//        std::cout << " " << firstBuffer[i];
//    }
//    std::cout << std::endl;

    for (int i = 0; i < 4; ++i) {
        double sum = 0.0;
        for (int k = 0; k < nPatterns; ++k) {
            sum += firstBuffer[i * nPatterns + k];
        }
        std::cout << "node " << i << ": " << sum << " ?= " << sumBuffer[i] << std::endl;
    }


    std::cout << "\n\ncheck cross-products  :\n";

    std::vector<double> element(32, 0.0);
    element[0] = element[16 + 0] = -1.0;
    element[1] = element[16 + 1] = 1.0;

    beagleSetTransitionMatrix(instance, 4, element.data(), 0.0);
    beagleSetTransitionMatrix(instance, 5, element.data(), 0.0);

    std::cout << "transpose = " << transpose << "\n";

    beagleCalculateEdgeDerivatives(instance,
                                   postBufferIndices, preBufferIndices,
                                   firstDervIndices,
                                   &categoryWeightsIndex,
                                   4,
                                   firstBuffer.data(),
                                   sumBuffer.data(),
                                   NULL);

    std::cout << "sum buffer for element:";
    double total = 0.0;
    for (int i = 0; i < 4; ++i) {
        total += sumBuffer[i];
        std::cout << " " << sumBuffer[i];
    }
    std::cout << " == " << total << "\n";

    firstBuffer[0] = 0.0;
    firstBuffer[1] = 0.0;

    beagleCalculateCrossProductDerivative(instance,
                                   postBufferIndices, preBufferIndices,
                                   &categoryRatesIndex, &categoryWeightsIndex,
                                          edgeLengths,
                                   4,
                                   firstBuffer.data(), nullptr);

    std::cout << "now: " << firstBuffer[0] << " " << firstBuffer[1] << " ?= " << (firstBuffer[1] - firstBuffer[0]) << std::endl;



//    std::cout






    free(patternWeights);

	free(patternLogLik);
    free(seepostPartials);
    free(seeprePartials);
    free(seerootPartials);
    free(tmpNumerator);
    free(grand_denominator);
    free(grand_numerator);
    free(gradient);
    free(diagonalHessian);
    free(matrix1);
    free(matrix2);

    beagleFinalizeInstance(instance);

#ifdef _WIN32
    std::cout << "\nPress ENTER to exit...\n";
    fflush( stdout);
    fflush( stderr);
    getchar();
#endif

}